

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O1

void Abc_NtkPrintBoxInfo(Abc_Ntk_t *pNtk)

{
  int *piVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Abc_Ntk_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  uint uVar8;
  uint *__ptr;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  if ((pNtk->pDesign != (Abc_Des_t *)0x0) &&
     (pVVar3 = pNtk->pDesign->vModules, pVVar3 != (Vec_Ptr_t *)0x0)) {
    if (1 < (long)pVVar3->nSize) {
      qsort(pVVar3->pArray,(long)pVVar3->nSize,8,Abc_NtkCompareNames);
    }
    uVar8 = pVVar3->nSize;
    lVar13 = (long)(int)uVar8;
    uVar7 = 0xffffffff;
    if (0 < lVar13) {
      lVar10 = 0;
      do {
        if ((Abc_Ntk_t *)pVVar3->pArray[lVar10] == pNtk) {
          uVar7 = (uint)lVar10;
          break;
        }
        lVar10 = lVar10 + 1;
      } while (lVar13 != lVar10);
    }
    if (((int)uVar7 < 0) || ((int)uVar8 <= (int)uVar7)) {
      __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                    ,0x1c3,"void Abc_NtkPrintBoxInfo(Abc_Ntk_t *)");
    }
    if ((int)uVar8 < 1) {
LAB_00848aed:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    ppvVar4 = pVVar3->pArray;
    pvVar9 = *ppvVar4;
    *ppvVar4 = ppvVar4[uVar7];
    pVVar3->pArray[uVar7] = pvVar9;
    __ptr = (uint *)malloc(0x10);
    uVar11 = 0x10;
    if (0x10 < uVar8) {
      uVar11 = (ulong)uVar8;
    }
    __ptr[1] = 0;
    *__ptr = (uint)uVar11;
    pvVar9 = malloc(uVar11 << 2);
    *(void **)(__ptr + 2) = pvVar9;
    __ptr[1] = uVar8;
    if (pvVar9 != (void *)0x0) {
      memset(pvVar9,0,lVar13 << 2);
    }
    if (0 < pVVar3->nSize) {
      lVar13 = 0;
      do {
        pAVar5 = (Abc_Ntk_t *)pVVar3->pArray[lVar13];
        if (pAVar5->vBoxes->nSize != 0) {
          uVar8 = __ptr[1];
          if ((int)*__ptr < (int)uVar8) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar9 = malloc((long)(int)uVar8 << 2);
            }
            else {
              pvVar9 = realloc(*(void **)(__ptr + 2),(long)(int)uVar8 << 2);
            }
            *(void **)(__ptr + 2) = pvVar9;
            if (pvVar9 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            *__ptr = uVar8;
          }
          if (0 < (int)uVar8) {
            memset(*(void **)(__ptr + 2),0,(ulong)uVar8 * 4);
          }
          pVVar6 = pAVar5->vBoxes;
          if (0 < pVVar6->nSize) {
            ppvVar4 = pVVar6->pArray;
            lVar10 = 0;
            do {
              pvVar9 = *(void **)((long)ppvVar4[lVar10] + 0x38);
              if (pvVar9 != (void *)0x0) {
                iVar2 = pVVar3->nSize;
                uVar7 = 0xffffffff;
                if (0 < (long)iVar2) {
                  lVar12 = 0;
                  do {
                    if (pVVar3->pArray[lVar12] == pvVar9) {
                      uVar7 = (uint)lVar12;
                      break;
                    }
                    lVar12 = lVar12 + 1;
                  } while (iVar2 != lVar12);
                }
                if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) {
                  __assert_fail("Num >= 0 && Num < Vec_PtrSize(vMods)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHie.c"
                                ,0x1d5,"void Abc_NtkPrintBoxInfo(Abc_Ntk_t *)");
                }
                if ((int)uVar8 <= (int)uVar7) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                }
                piVar1 = (int *)(*(long *)(__ptr + 2) + (ulong)uVar7 * 4);
                *piVar1 = *piVar1 + 1;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 < pVVar6->nSize);
          }
          printf("MODULE  ");
          printf("%-30s : ",pAVar5->pName);
          printf("PI=%6d ",(ulong)(uint)pAVar5->vPis->nSize);
          printf("PO=%6d ",(ulong)(uint)pAVar5->vPos->nSize);
          printf("BB=%6d ",(ulong)(uint)pAVar5->vBoxes->nSize);
          printf("ND=%6d ",(ulong)(uint)pAVar5->nObjCounts[7]);
          Abc_NtkLevel(pAVar5);
          printf("Lev=%5d ");
          putchar(10);
          if (0 < (int)uVar8) {
            lVar10 = *(long *)(__ptr + 2);
            uVar11 = 0;
            do {
              uVar7 = *(uint *)(lVar10 + uVar11 * 4);
              if (uVar7 != 0) {
                if ((long)pVVar3->nSize <= (long)uVar11) goto LAB_00848aed;
                printf("%15d : %s\n",(ulong)uVar7,*(undefined8 *)((long)pVVar3->pArray[uVar11] + 8))
                ;
              }
              uVar11 = uVar11 + 1;
            } while (uVar8 != uVar11);
          }
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar3->nSize);
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    if (0 < pVVar3->nSize) {
      lVar13 = 0;
      do {
        pAVar5 = (Abc_Ntk_t *)pVVar3->pArray[lVar13];
        if (pAVar5->vBoxes->nSize == 0) {
          printf("MODULE   ");
          printf("%-30s : ",pAVar5->pName);
          printf("PI=%6d ",(ulong)(uint)pAVar5->vPis->nSize);
          printf("PO=%6d ",(ulong)(uint)pAVar5->vPos->nSize);
          printf("BB=%6d ",(ulong)(uint)pAVar5->vBoxes->nSize);
          printf("ND=%6d ",(ulong)(uint)pAVar5->nObjCounts[7]);
          uVar8 = Abc_NtkLevel(pAVar5);
          printf("Lev=%5d ",(ulong)uVar8);
          putchar(10);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar3->nSize);
    }
  }
  return;
}

Assistant:

void Abc_NtkPrintBoxInfo( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel, * pBoxModel;
    Abc_Obj_t * pObj;
    Vec_Int_t * vCounts;
    int i, k, Num;
    if ( pNtk->pDesign == NULL || pNtk->pDesign->vModules == NULL )
    {
//        printf( "There is no hierarchy information.\n" );
        return;
    }
    // sort models by name
    vMods = pNtk->pDesign->vModules;
    Vec_PtrSort( vMods, (int(*)())Abc_NtkCompareNames );
//    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
//        printf( "%s\n", Abc_NtkName(pModel) );

    // swap the first model
    Num = Vec_PtrFind( vMods, pNtk );
    assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
    pBoxModel = (Abc_Ntk_t *)Vec_PtrEntry(vMods, 0);
    Vec_PtrWriteEntry(vMods, 0, (Abc_Ntk_t *)Vec_PtrEntry(vMods, Num) );
    Vec_PtrWriteEntry(vMods, Num, pBoxModel );

    // print models
    vCounts = Vec_IntStart( Vec_PtrSize(vMods) );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        if ( Abc_NtkBoxNum(pModel) == 0 )
            continue;
        Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
        Abc_NtkForEachBox( pModel, pObj, k )
        {
            pBoxModel = (Abc_Ntk_t *)pObj->pData;
            if ( pBoxModel == NULL )
                continue;
            Num = Vec_PtrFind( vMods, pBoxModel );
            assert( Num >= 0 && Num < Vec_PtrSize(vMods) );
            Vec_IntAddToEntry( vCounts, Num, 1 );
        }

//        Abc_NtkPrintStats( pModel, 0, 0, 0, 0, 0, 0, 0, 0, 0 );
        printf( "MODULE  " );
        printf( "%-30s : ", Abc_NtkName(pModel) );
        printf( "PI=%6d ", Abc_NtkPiNum(pModel) );
        printf( "PO=%6d ", Abc_NtkPoNum(pModel) );
        printf( "BB=%6d ", Abc_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Abc_NtkNodeNum(pModel) ); // sans constants
        printf( "Lev=%5d ", Abc_NtkLevel(pModel) );
        printf( "\n" );

        Vec_IntForEachEntry( vCounts, Num, k )
            if ( Num )
                printf( "%15d : %s\n", Num, Abc_NtkName((Abc_Ntk_t *)Vec_PtrEntry(vMods, k)) );
    }
    Vec_IntFree( vCounts );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        if ( Abc_NtkBoxNum(pModel) != 0 )
            continue;
        printf( "MODULE   " );
        printf( "%-30s : ", Abc_NtkName(pModel) );
        printf( "PI=%6d ", Abc_NtkPiNum(pModel) );
        printf( "PO=%6d ", Abc_NtkPoNum(pModel) );
        printf( "BB=%6d ", Abc_NtkBoxNum(pModel) );
        printf( "ND=%6d ", Abc_NtkNodeNum(pModel) );
        printf( "Lev=%5d ", Abc_NtkLevel(pModel) );
        printf( "\n" );
    }
}